

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O3

void __thiscall OctreeTracer::Resize(OctreeTracer *this,uint32_t width,uint32_t height)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  Ptr<Device> *device;
  uint32_t uVar5;
  uint32_t uVar6;
  pointer pFVar7;
  element_type *local_78;
  element_type *peStack_70;
  VkImage local_60;
  element_type *local_58;
  element_type *peStack_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  VkExtent2D local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this->m_width = width;
  this->m_height = height;
  uVar6 = (width + 7 >> 3) + 1;
  uVar5 = (height + 7 >> 3) + 1;
  pFVar7 = (this->m_frame_resources).
           super__Vector_base<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (pFVar7->m_beam_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((((peVar1->super_ImageBase).m_extent.width != uVar6) ||
      ((peVar1->super_ImageBase).m_extent.height != uVar5)) &&
     (local_38._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->m_frame_resources).
           super__Vector_base<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
           ._M_impl.super__Vector_impl_data._M_finish, pFVar7 != (pointer)local_38._M_pi)) {
    local_60 = (VkImage)&this->m_beam_render_pass;
    do {
      device = (Ptr<Device> *)
               (**(code **)((long)(((pFVar7->m_beam_image).
                                    super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->super_ImageBase).super_DeviceObjectBase.super_Base.
                                  _vptr_Base + 0x10))();
      local_58 = (element_type *)0x0;
      peStack_50 = (element_type *)0x0;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_40.width = uVar6;
      local_40.height = uVar5;
      myvk::Image::CreateTexture2D
                ((Image *)&local_78,device,&local_40,1,VK_FORMAT_R32_SFLOAT,0x14,
                 (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                  *)&local_58);
      peVar3 = peStack_70;
      peVar1 = local_78;
      local_78 = (element_type *)0x0;
      peStack_70 = (element_type *)0x0;
      p_Var2 = (pFVar7->m_beam_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pFVar7->m_beam_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar1;
      (pFVar7->m_beam_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        if (peStack_70 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
        }
      }
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)&local_58);
      local_78 = (pFVar7->m_beam_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      peStack_70 = (element_type *)
                   (pFVar7->m_beam_image).
                   super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (peStack_70 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peStack_70->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                   super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peStack_70->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                        super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(peStack_70->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                   super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peStack_70->super_enable_shared_from_this<myvk::Base>)._M_weak_this.
                        super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      myvk::ImageView::Create
                ((ImageView *)&local_58,(Ptr<ImageBase> *)&local_78,VK_IMAGE_VIEW_TYPE_2D,1);
      peVar3 = peStack_50;
      peVar4 = local_58;
      local_58 = (element_type *)0x0;
      peStack_50 = (element_type *)0x0;
      p_Var2 = (pFVar7->m_beam_image_view).
               super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pFVar7->m_beam_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)peVar4;
      (pFVar7->m_beam_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        if (peStack_50 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
        }
      }
      if (peStack_70 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_70);
      }
      myvk::Framebuffer::Create
                ((Framebuffer *)&local_58,(Ptr<RenderPass> *)local_60,&pFVar7->m_beam_image_view);
      peVar3 = peStack_50;
      peVar4 = local_58;
      local_58 = (element_type *)0x0;
      peStack_50 = (element_type *)0x0;
      p_Var2 = (pFVar7->m_beam_framebuffer).
               super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pFVar7->m_beam_framebuffer).super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar4;
      (pFVar7->m_beam_framebuffer).super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        if (peStack_50 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
        }
      }
      myvk::DescriptorSet::UpdateCombinedImageSampler
                ((pFVar7->m_descriptor_set).
                 super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &pFVar7->m_beam_sampler,&pFVar7->m_beam_image_view,0,0);
      pFVar7 = pFVar7 + 1;
    } while (pFVar7 != (pointer)local_38._M_pi);
  }
  return;
}

Assistant:

void OctreeTracer::Resize(uint32_t width, uint32_t height) {
	m_width = width;
	m_height = height;

	uint32_t beam_width = get_beam_size(m_width), beam_height = get_beam_size(m_height);
	if (m_frame_resources[0].m_beam_image->GetExtent().width != beam_width ||
	    m_frame_resources[0].m_beam_image->GetExtent().height != beam_height) {
		for (auto &i : m_frame_resources) {
			i.m_beam_image = myvk::Image::CreateTexture2D(
			    i.m_beam_image->GetDevicePtr(), {beam_width, beam_height}, 1, VK_FORMAT_R32_SFLOAT,
			    VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT);
			i.m_beam_image_view = myvk::ImageView::Create(i.m_beam_image, VK_IMAGE_VIEW_TYPE_2D);
			i.m_beam_framebuffer = myvk::Framebuffer::Create(m_beam_render_pass, i.m_beam_image_view);
			i.m_descriptor_set->UpdateCombinedImageSampler(i.m_beam_sampler, i.m_beam_image_view, 0);
		}
	}
}